

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O3

void gc_pose_log(gc_pose *x)

{
  matrix3x3 *pmVar1;
  vector3 *pvVar2;
  long lVar3;
  
  if (x == (gc_pose *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x3a,"void gc_pose_log(const struct gc_pose *)");
  }
  if ((x->rotation != (matrix3x3 *)0x0) && (x->translation != (vector3 *)0x0)) {
    printf("PoseCoord(rotation=[");
    lVar3 = 0;
    while( true ) {
      if (lVar3 != 0) {
        printf("                    ");
      }
      pmVar1 = x->rotation;
      printf("[%5.2f, %5.2f, %5.2f]",*(undefined8 *)((long)&pmVar1->field_0 + lVar3),
             *(undefined8 *)((long)&pmVar1->field_0 + lVar3 + 8),
             *(undefined8 *)((long)&pmVar1->field_0 + lVar3 + 0x10));
      if (lVar3 == 0x30) break;
      puts(",");
      lVar3 = lVar3 + 0x18;
    }
    pvVar2 = x->translation;
    printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",(pvVar2->field_0).field_0.x,
           (pvVar2->field_0).field_0.y,(pvVar2->field_0).field_0.z);
    return;
  }
  __assert_fail("x->rotation && x->translation",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x3b,"void gc_pose_log(const struct gc_pose *)");
}

Assistant:

void gc_pose_log(
        const struct gc_pose *x)
{
    assert(x);
    assert(x->rotation && x->translation);

    printf("PoseCoord(rotation=[");
    for (int i = 0; i < 3; i++) {
        if (i != 0) printf("                    ");
        printf("[%5.2f, %5.2f, %5.2f]",
                x->rotation->row[i].x,
                x->rotation->row[i].y,
                x->rotation->row[i].z);
        if (i != 2) printf(",\n");
    }
    printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",
            x->translation->x,
            x->translation->y,
            x->translation->z);
}